

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryKinematicsScenesLoader.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL::LibraryKinematicsScenesLoader::begin__instance_articulated_system
          (LibraryKinematicsScenesLoader *this,
          instance_articulated_system__AttributeData *attributeData)

{
  int iVar1;
  undefined4 extraout_var;
  String *uriStr;
  KinematicsInstanceArticulatedSystem *this_00;
  URI absoluteUrl;
  URI local_100;
  
  iVar1 = (*(this->super_FilePartLoader).super_IFilePartLoader.super_ExtraDataLoader.
            _vptr_ExtraDataLoader[0xb])();
  uriStr = COLLADABU::URI::getURIString_abi_cxx11_(&attributeData->url);
  COLLADABU::URI::URI(&local_100,(URI *)CONCAT44(extraout_var,iVar1),uriStr);
  this_00 = (KinematicsInstanceArticulatedSystem *)operator_new(0x150);
  KinematicsInstanceArticulatedSystem::KinematicsInstanceArticulatedSystem(this_00,&local_100);
  InstanceArticulatedSystemLoader::setInstanceArticulatedSystem
            (&this->mInstanceArticulatedSystemLoader,this_00);
  COLLADABU::URI::~URI(&local_100);
  return true;
}

Assistant:

bool LibraryKinematicsScenesLoader::begin__instance_articulated_system( const instance_articulated_system__AttributeData& attributeData )
	{
		COLLADABU::URI absoluteUrl(getFileUri(), attributeData.url.getURIString());

		KinematicsInstanceArticulatedSystem* instanceArticulatedSystem = new KinematicsInstanceArticulatedSystem(absoluteUrl);
		mInstanceArticulatedSystemLoader.setInstanceArticulatedSystem(instanceArticulatedSystem);
		return true;
	}